

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GED_EnhancedRotaryWingAircraft.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GED_EnhancedRotaryWingAircraft::operator==
          (GED_EnhancedRotaryWingAircraft *this,GED_EnhancedRotaryWingAircraft *Value)

{
  KBOOL KVar1;
  GED_EnhancedRotaryWingAircraft *Value_local;
  GED_EnhancedRotaryWingAircraft *this_local;
  
  KVar1 = GED_BasicRotorWingAircraft::operator!=
                    (&this->super_GED_BasicRotorWingAircraft,
                     &Value->super_GED_BasicRotorWingAircraft);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if ((this->super_GED_BasicRotorWingAircraft).field_0x2c ==
           (Value->super_GED_BasicRotorWingAircraft).field_0x2c) {
    if ((this->super_GED_BasicRotorWingAircraft).field_0x2d ==
        (Value->super_GED_BasicRotorWingAircraft).field_0x2d) {
      if ((this->super_GED_BasicRotorWingAircraft).field_0x2e ==
          (Value->super_GED_BasicRotorWingAircraft).field_0x2e) {
        if ((this->super_GED_BasicRotorWingAircraft).field_0x2f ==
            (Value->super_GED_BasicRotorWingAircraft).field_0x2f) {
          this_local._7_1_ = true;
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GED_EnhancedRotaryWingAircraft::operator == ( const GED_EnhancedRotaryWingAircraft & Value ) const
{
    if( GED_BasicRotorWingAircraft::operator!=( Value ) )  return false;
    if( m_ui8SupFuelStatus  != Value.m_ui8SupFuelStatus )  return false;
    if( m_ui8AirMaintStatus != Value.m_ui8AirMaintStatus ) return false;
    if( m_ui8PriAmmun       != Value.m_ui8PriAmmun )       return false;
    if( m_ui8SecAmmun       != Value.m_ui8SecAmmun )       return false;
    return true;
}